

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
::format(elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong uVar4;
  format_decimal_result<char_*> fVar5;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  lVar3 = (msg->time).__d.__r;
  uVar2 = lVar3 - (this->last_message_time_).__d.__r;
  uVar4 = 0;
  if (0 < (long)uVar2) {
    uVar4 = uVar2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar4 = SUB168(auVar1 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
  (this->last_message_time_).__d.__r = lVar3;
  lVar3 = 0x3f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&local_60,
             (ulong)((uint)(byte)fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar3] -
                    (uint)(uVar4 < *(ulong *)(fmt::v9::detail::do_count_digits(unsigned_long)::
                                              zero_or_powers_of_10 +
                                             (ulong)(byte)fmt::v9::detail::
                                                          do_count_digits(unsigned_long)::bsr2log10
                                                          [lVar3] * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  fVar5 = fmt::v9::detail::format_decimal<char,unsigned_long>(local_38,uVar4,0x15);
  local_20 = fVar5.begin;
  lVar3 = (long)local_38 - (long)local_20;
  if (-0x16 < lVar3) {
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,local_20 + lVar3 + 0x15);
    scoped_padder::~scoped_padder(&local_60);
    return;
  }
  fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const {
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_) {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    auto cloned = details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_,
                                                          std::move(cloned_custom_formatters));
    cloned->need_localtime(need_localtime_);
#if defined(__GNUC__) && __GNUC__ < 5
    return std::move(cloned);
#else
    return cloned;
#endif
}